

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateClear
          (MessageGenerator *this,Printer *printer)

{
  uint uVar1;
  Printer *pPVar2;
  bool bVar3;
  int iVar4;
  CppType CVar5;
  FieldGenerator *pFVar6;
  FieldDescriptor *pFVar7;
  FileDescriptor *file;
  int extraout_EDX;
  int i_00;
  FieldDescriptor *extraout_RDX;
  FieldDescriptor *extraout_RDX_00;
  char *pcVar8;
  bool local_a9;
  FieldDescriptor *field_1;
  undefined1 local_78 [4];
  int i_1;
  bool local_55;
  bool should_check_bit;
  string local_48;
  FieldDescriptor *local_28;
  FieldDescriptor *field;
  int i;
  int last_index;
  Printer *printer_local;
  MessageGenerator *this_local;
  
  _i = printer;
  printer_local = (Printer *)this;
  io::Printer::Print(printer,"void $classname$::Clear() {\n","classname",&this->classname_);
  io::Printer::Indent(_i);
  field._4_4_ = 0xffffffff;
  iVar4 = Descriptor::extension_range_count(this->descriptor_);
  if (0 < iVar4) {
    io::Printer::Print(_i,"_extensions_.Clear();\n");
  }
  for (field._0_4_ = 0; uVar1 = (uint)field, iVar4 = Descriptor::field_count(this->descriptor_),
      (int)uVar1 < iVar4; field._0_4_ = (uint)field + 1) {
    pcVar8 = (char *)(ulong)(uint)field;
    local_28 = Descriptor::field(this->descriptor_,(uint)field);
    bVar3 = FieldDescriptor::is_repeated(local_28);
    if (!bVar3) {
      iVar4 = (int)field._4_4_ % 8;
      if (((int)(uint)field / 8 != (int)field._4_4_ / 8) || ((int)field._4_4_ < 0)) {
        if (-1 < (int)field._4_4_) {
          io::Printer::Outdent(_i);
          pcVar8 = "}\n";
          io::Printer::Print(_i,"}\n");
          iVar4 = extraout_EDX;
        }
        pPVar2 = _i;
        pcVar8 = FieldDescriptor::index(local_28,pcVar8,iVar4);
        SimpleItoa_abi_cxx11_(&local_48,(protobuf *)((ulong)pcVar8 & 0xffffffff),i_00);
        io::Printer::Print(pPVar2,"if (_has_bits_[$index$ / 32] & (0xffu << ($index$ % 32))) {\n",
                           "index",&local_48);
        std::__cxx11::string::~string((string *)&local_48);
        io::Printer::Indent(_i);
      }
      field._4_4_ = (uint)field;
      CVar5 = FieldDescriptor::cpp_type(local_28);
      local_a9 = true;
      pFVar7 = extraout_RDX;
      if (CVar5 != CPPTYPE_MESSAGE) {
        CVar5 = FieldDescriptor::cpp_type(local_28);
        local_a9 = CVar5 == CPPTYPE_STRING;
        pFVar7 = extraout_RDX_00;
      }
      pPVar2 = _i;
      local_55 = local_a9;
      if (local_a9 != false) {
        FieldName_abi_cxx11_((string *)local_78,(cpp *)local_28,pFVar7);
        io::Printer::Print(pPVar2,"if (has_$name$()) {\n","name",(string *)local_78);
        std::__cxx11::string::~string((string *)local_78);
        io::Printer::Indent(_i);
      }
      pFVar6 = FieldGeneratorMap::get(&this->field_generators_,local_28);
      (*pFVar6->_vptr_FieldGenerator[6])(pFVar6,_i);
      if ((local_55 & 1U) != 0) {
        io::Printer::Outdent(_i);
        io::Printer::Print(_i,"}\n");
      }
    }
  }
  if (-1 < (int)field._4_4_) {
    io::Printer::Outdent(_i);
    io::Printer::Print(_i,"}\n");
  }
  for (field_1._4_4_ = 0; iVar4 = Descriptor::field_count(this->descriptor_), field_1._4_4_ < iVar4;
      field_1._4_4_ = field_1._4_4_ + 1) {
    pFVar7 = Descriptor::field(this->descriptor_,field_1._4_4_);
    bVar3 = FieldDescriptor::is_repeated(pFVar7);
    if (bVar3) {
      pFVar6 = FieldGeneratorMap::get(&this->field_generators_,pFVar7);
      (*pFVar6->_vptr_FieldGenerator[6])(pFVar6,_i);
    }
  }
  io::Printer::Print(_i,"::memset(_has_bits_, 0, sizeof(_has_bits_));\n");
  file = Descriptor::file(this->descriptor_);
  bVar3 = HasUnknownFields(file);
  if (bVar3) {
    io::Printer::Print(_i,"mutable_unknown_fields()->Clear();\n");
  }
  io::Printer::Outdent(_i);
  io::Printer::Print(_i,"}\n");
  return;
}

Assistant:

void MessageGenerator::
GenerateClear(io::Printer* printer) {
  printer->Print("void $classname$::Clear() {\n",
                 "classname", classname_);
  printer->Indent();

  int last_index = -1;

  if (descriptor_->extension_range_count() > 0) {
    printer->Print("_extensions_.Clear();\n");
  }

  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = descriptor_->field(i);

    if (!field->is_repeated()) {
      // We can use the fact that _has_bits_ is a giant bitfield to our
      // advantage:  We can check up to 32 bits at a time for equality to
      // zero, and skip the whole range if so.  This can improve the speed
      // of Clear() for messages which contain a very large number of
      // optional fields of which only a few are used at a time.  Here,
      // we've chosen to check 8 bits at a time rather than 32.
      if (i / 8 != last_index / 8 || last_index < 0) {
        if (last_index >= 0) {
          printer->Outdent();
          printer->Print("}\n");
        }
        printer->Print(
          "if (_has_bits_[$index$ / 32] & (0xffu << ($index$ % 32))) {\n",
          "index", SimpleItoa(field->index()));
        printer->Indent();
      }
      last_index = i;

      // It's faster to just overwrite primitive types, but we should
      // only clear strings and messages if they were set.
      // TODO(kenton):  Let the CppFieldGenerator decide this somehow.
      bool should_check_bit =
        field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE ||
        field->cpp_type() == FieldDescriptor::CPPTYPE_STRING;

      if (should_check_bit) {
        printer->Print(
          "if (has_$name$()) {\n",
          "name", FieldName(field));
        printer->Indent();
      }

      field_generators_.get(field).GenerateClearingCode(printer);

      if (should_check_bit) {
        printer->Outdent();
        printer->Print("}\n");
      }
    }
  }

  if (last_index >= 0) {
    printer->Outdent();
    printer->Print("}\n");
  }

  // Repeated fields don't use _has_bits_ so we clear them in a separate
  // pass.
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = descriptor_->field(i);

    if (field->is_repeated()) {
      field_generators_.get(field).GenerateClearingCode(printer);
    }
  }

  printer->Print(
    "::memset(_has_bits_, 0, sizeof(_has_bits_));\n");

  if (HasUnknownFields(descriptor_->file())) {
    printer->Print(
      "mutable_unknown_fields()->Clear();\n");
  }

  printer->Outdent();
  printer->Print("}\n");
}